

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void free_symbols(MOJOSHADER_free f,void *d,MOJOSHADER_symbol *syms,int symcount)

{
  ulong uVar1;
  MOJOSHADER_symbolTypeInfo *typeinfo;
  
  if (0 < symcount) {
    uVar1 = (ulong)(uint)symcount;
    typeinfo = &syms->info;
    do {
      (*f)(*(void **)&typeinfo[-1].rows,d);
      free_sym_typeinfo(f,d,typeinfo);
      typeinfo = (MOJOSHADER_symbolTypeInfo *)&typeinfo[1].members;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  (*f)(syms,d);
  return;
}

Assistant:

static void free_symbols(MOJOSHADER_free f, void *d, MOJOSHADER_symbol *syms,
                         const int symcount)
{
    int i;
    for (i = 0; i < symcount; i++)
    {
        f((void *) syms[i].name, d);
        free_sym_typeinfo(f, d, &syms[i].info);
    } // for
    f((void *) syms, d);
}